

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

void __thiscall Clasp::Solver::undoLevel(Solver *this,bool sp)

{
  ConstraintDB *pCVar1;
  Constraint *pCVar2;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *this_00;
  uint uVar3;
  pointer pDVar4;
  ulong uVar5;
  ulong uVar6;
  ConstraintDB *local_28;
  
  Assignment::undoTrail
            (&this->assign_,
             *(uint *)((this->levels_).super_type.ebo_.buf +
                      ((this->levels_).super_type.ebo_.size - 1)) & 0x3fffffff,sp);
  pDVar4 = (this->levels_).super_type.ebo_.buf;
  uVar3 = (this->levels_).super_type.ebo_.size - 1;
  uVar5 = (ulong)uVar3;
  pCVar1 = pDVar4[uVar5].undo;
  if (pCVar1 != (ConstraintDB *)0x0) {
    uVar6 = (ulong)(pCVar1->ebo_).size;
    if (uVar6 != 0) {
      uVar5 = 0;
      do {
        pCVar2 = (pCVar1->ebo_).buf[uVar5];
        (*pCVar2->_vptr_Constraint[3])(pCVar2,this);
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
      pDVar4 = (this->levels_).super_type.ebo_.buf;
      uVar5 = (ulong)((this->levels_).super_type.ebo_.size - 1);
    }
    this_00 = pDVar4[uVar5].undo;
    (this_00->ebo_).size = 0;
    local_28 = this->undoHead_;
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
              (this_00,(Constraint **)&local_28);
    this->undoHead_ = this_00;
    uVar3 = (this->levels_).super_type.ebo_.size - 1;
  }
  (this->levels_).super_type.ebo_.size = uVar3;
  return;
}

Assistant:

void Solver::undoLevel(bool sp) {
	assert(decisionLevel() != 0 && levels_.back().trailPos != assign_.trail.size() && "Decision Level must not be empty");
	assign_.undoTrail(levels_.back().trailPos, sp);
	if (levels_.back().undo) {
		const ConstraintDB& undoList = *levels_.back().undo;
		for (ConstraintDB::size_type i = 0, end = undoList.size(); i != end; ++i) {
			undoList[i]->undoLevel(*this);
		}
		undoFree(levels_.back().undo);
	}
	levels_.pop_back();
}